

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O2

bool __thiscall
mocker::detail::InterferenceGraph::conservative(InterferenceGraph *this,Node *x,Node *y)

{
  mapped_type *pmVar1;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  *xs;
  __node_base _Var2;
  ulong uVar3;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  neighborsOfX;
  RegSet neighbors;
  undefined1 local_82;
  undefined1 local_81;
  undefined1 local_80 [32];
  _Prime_rehash_policy local_60;
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_50;
  
  getCurAdjList((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 *)(local_80 + 0x18),this,x);
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>,std::__detail::_Identity,mocker::nasm::RegPtrEqual,mocker::nasm::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _Hashtable<__gnu_cxx::__normal_iterator<std::shared_ptr<mocker::nasm::Register>*,std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>>>
            ((_Hashtable<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>,std::__detail::_Identity,mocker::nasm::RegPtrEqual,mocker::nasm::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&local_50,local_80._24_8_,local_60._0_8_,0,local_80,&local_81,&local_82);
  getCurAdjList((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 *)local_80,this,y);
  unionSet<std::unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>,std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>>
            ((mocker *)&local_50,
             (unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              *)local_80,xs);
  std::
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             *)local_80);
  uVar3 = 0;
  for (_Var2._M_nxt = local_50._M_before_begin._M_nxt; _Var2._M_nxt != (_Hash_node_base *)0x0;
      _Var2._M_nxt = (_Var2._M_nxt)->_M_nxt) {
    pmVar1 = std::__detail::
             _Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)&this->curDegree,(key_type *)(_Var2._M_nxt + 1));
    uVar3 = (uVar3 + 1) - (ulong)(*pmVar1 < 0xe);
  }
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_50);
  std::
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             *)(local_80 + 0x18));
  return uVar3 < 0xe;
}

Assistant:

bool InterferenceGraph::conservative(const Node &x, const Node &y) const {
  auto neighborsOfX = getCurAdjList(x);
  RegSet neighbors(neighborsOfX.begin(), neighborsOfX.end());
  unionSet(neighbors, getCurAdjList(y));
  std::size_t k = 0;
  for (auto &m : neighbors) {
    if (curDegree.at(m) >= K)
      ++k;
  }
  return k < K;
}